

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

IssuanceParameter *
cfd::core::ConfidentialTransaction::CalculateIssuanceValue
          (IssuanceParameter *__return_storage_ptr__,Txid *txid,uint32_t vout,bool is_blind,
          ByteData256 *contract_hash,ByteData256 *asset_entropy)

{
  bool bVar1;
  ConfidentialAssetId asset;
  BlindFactor entropy;
  ConfidentialAssetId token;
  bool local_f9;
  ConfidentialAssetId local_f8;
  BlindFactor local_d0;
  CfdSourceLocation local_b0;
  string local_98;
  string local_78;
  ConfidentialAssetId local_58;
  
  local_f9 = is_blind;
  IssuanceParameter::IssuanceParameter(__return_storage_ptr__);
  bVar1 = ByteData256::Equals(asset_entropy,(ByteData256 *)kEmptyByteData256);
  if (bVar1) {
    CalculateAssetEntropy(&local_d0,txid,vout,contract_hash);
    BlindFactor::operator=(&__return_storage_ptr__->entropy,&local_d0);
    CalculateAsset(&local_f8,&local_d0);
    ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_f8);
    CalculateReissuanceToken(&local_58,&local_d0,is_blind);
    ConfidentialAssetId::operator=(&__return_storage_ptr__->token,&local_58);
    local_b0.filename = "cfdcore_elements_transaction.cpp";
    local_b0.line = 0x864;
    local_b0.funcname = "CalculateIssuanceValue";
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_78,&__return_storage_ptr__->asset);
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_98,&__return_storage_ptr__->token);
    logger::info<std::__cxx11::string,std::__cxx11::string,bool&>
              (&local_b0,"asset[{}] token[{}] is_blind[{}]",&local_78,&local_98,&local_f9);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_78);
    ConfidentialAssetId::~ConfidentialAssetId(&local_58);
    ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    BlindFactor::~BlindFactor(&local_d0);
  }
  else {
    BlindFactor::BlindFactor((BlindFactor *)&local_f8,contract_hash);
    BlindFactor::operator=(&__return_storage_ptr__->entropy,(BlindFactor *)&local_f8);
    BlindFactor::~BlindFactor((BlindFactor *)&local_f8);
    CalculateAsset(&local_f8,&__return_storage_ptr__->entropy);
    ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_f8);
    ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::CalculateIssuanceValue(
    const Txid &txid, uint32_t vout, bool is_blind,
    const ByteData256 &contract_hash, const ByteData256 &asset_entropy) {
  IssuanceParameter result;

  if (!asset_entropy.Equals(kEmptyByteData256)) {
    // reissue
    result.entropy = BlindFactor(contract_hash);
    result.asset = CalculateAsset(
        result.entropy);  // ConfidentialAssetId(ByteData(asset));
    return result;
  }

  // calculate issue value
  const BlindFactor entropy = CalculateAssetEntropy(txid, vout, contract_hash);
  result.entropy = entropy;

  // calculate asset value
  const ConfidentialAssetId asset = CalculateAsset(entropy);
  result.asset = asset;

  // calculate token
  const ConfidentialAssetId token =
      CalculateReissuanceToken(entropy, is_blind);
  result.token = token;

  info(
      CFD_LOG_SOURCE, "asset[{}] token[{}] is_blind[{}]",
      result.asset.GetHex(), result.token.GetHex(), is_blind);
  return result;
}